

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::RenderStairs<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLogLin>
               (GetterXsYs<unsigned_long_long> *getter,TransformerLogLin *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  ImPlotContext *pIVar1;
  bool bVar2;
  int i;
  int idx;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ImPlotPoint IVar5;
  ImVec2 p1;
  ImVec2 p2;
  ImVec2 p12;
  
  pIVar1 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    StairsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLin>::
    StairsRenderer((StairsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLin>
                    *)&p12,getter,transformer,col,line_weight);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLogLin>>
              ((StairsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLin> *)
               &p12,DrawList,&pIVar1->CurrentPlot->PlotRect);
  }
  else {
    IVar5 = GetterXsYs<unsigned_long_long>::operator()(getter,0);
    p12 = (ImVec2)IVar5.x;
    p1 = TransformerLogLin::operator()(transformer,(ImPlotPoint *)&p12);
    for (idx = 1; idx < getter->Count; idx = idx + 1) {
      IVar5 = GetterXsYs<unsigned_long_long>::operator()(getter,idx);
      p12 = (ImVec2)IVar5.x;
      p2 = TransformerLogLin::operator()(transformer,(ImPlotPoint *)&p12);
      auVar3._8_8_ = 0;
      auVar3._0_4_ = p1.x;
      auVar3._4_4_ = p1.y;
      auVar4._8_4_ = extraout_XMM0_Dc;
      auVar4._0_4_ = p2.x;
      auVar4._4_4_ = p2.y;
      auVar4._12_4_ = extraout_XMM0_Dd;
      auVar4 = minps(auVar3,auVar4);
      p12 = auVar4._0_8_;
      bVar2 = ImRect::Overlaps(&pIVar1->CurrentPlot->PlotRect,(ImRect *)&p12);
      if (bVar2) {
        p12.y = p1.y;
        p12.x = p2.x;
        ImDrawList::AddLine(DrawList,&p1,&p12,col,line_weight);
        ImDrawList::AddLine(DrawList,&p12,&p2,col,line_weight);
      }
      p1 = p2;
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}